

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

int glfwExtensionSupported(char *extension)

{
  int iVar1;
  undefined8 in_RAX;
  _GLFWwindow *p_Var2;
  GLubyte *pGVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  GLint count;
  undefined8 uStack_38;
  
  if (_glfwInitialized == '\0') {
    iVar1 = 0x10001;
  }
  else {
    uStack_38 = in_RAX;
    p_Var2 = _glfwPlatformGetCurrentContext();
    if (p_Var2 == (_GLFWwindow *)0x0) {
      iVar1 = 0x10002;
    }
    else {
      if (*extension != '\0') {
        if ((p_Var2->context).major < 3) {
          pGVar3 = (GLubyte *)glGetString(0x1f03);
          if (pGVar3 == (GLubyte *)0x0) {
            bVar7 = false;
            _glfwInputError(0x10008,"Failed to retrieve extension string");
          }
          else {
            iVar1 = _glfwStringInExtensionString(extension,pGVar3);
            bVar7 = iVar1 == 0;
          }
          if (!bVar7) {
            return (uint)(pGVar3 != (GLubyte *)0x0);
          }
        }
        else {
          uVar5 = (long)&uStack_38 + 4;
          glGetIntegerv(0x821d,uVar5);
          bVar7 = 0 < uStack_38._4_4_;
          if (0 < uStack_38._4_4_) {
            uVar4 = 0;
            do {
              pGVar3 = (*p_Var2->GetStringi)(0x1f03,uVar4);
              if (pGVar3 == (GLubyte *)0x0) {
                bVar6 = false;
                _glfwInputError(0x10008,"Failed to retrieve extension string %i",(ulong)uVar4);
                uVar5 = 0;
              }
              else {
                iVar1 = strcmp((char *)pGVar3,extension);
                bVar6 = iVar1 != 0;
                uVar5 = uVar5 & 0xffffffff;
                if (!bVar6) {
                  uVar5 = 1;
                }
              }
              if (!bVar6) break;
              uVar4 = uVar4 + 1;
              bVar7 = (int)uVar4 < uStack_38._4_4_;
            } while ((int)uVar4 < uStack_38._4_4_);
          }
          if (bVar7) {
            return (int)uVar5;
          }
        }
        iVar1 = _glfwPlatformExtensionSupported(extension);
        return iVar1;
      }
      iVar1 = 0x10004;
    }
  }
  _glfwInputError(iVar1,(char *)0x0);
  return 0;
}

Assistant:

GLFWAPI int glfwExtensionSupported(const char* extension)
{
    _GLFWwindow* window;

    _GLFW_REQUIRE_INIT_OR_RETURN(GL_FALSE);

    window = _glfwPlatformGetCurrentContext();
    if (!window)
    {
        _glfwInputError(GLFW_NO_CURRENT_CONTEXT, NULL);
        return GL_FALSE;
    }

    if (*extension == '\0')
    {
        _glfwInputError(GLFW_INVALID_VALUE, NULL);
        return GL_FALSE;
    }

#if defined(_GLFW_USE_OPENGL)
    if (window->context.major >= 3)
    {
        int i;
        GLint count;

        // Check if extension is in the modern OpenGL extensions string list

        glGetIntegerv(GL_NUM_EXTENSIONS, &count);

        for (i = 0;  i < count;  i++)
        {
            const char* en = (const char*) window->GetStringi(GL_EXTENSIONS, i);
            if (!en)
            {
                _glfwInputError(GLFW_PLATFORM_ERROR,
                                "Failed to retrieve extension string %i", i);
                return GL_FALSE;
            }

            if (strcmp(en, extension) == 0)
                return GL_TRUE;
        }
    }
    else
#endif // _GLFW_USE_OPENGL
    {
        // Check if extension is in the old style OpenGL extensions string

        const GLubyte* extensions = glGetString(GL_EXTENSIONS);
        if (!extensions)
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "Failed to retrieve extension string");
            return GL_FALSE;
        }

        if (_glfwStringInExtensionString(extension, extensions))
            return GL_TRUE;
    }

    // Check if extension is in the platform-specific string
    return _glfwPlatformExtensionSupported(extension);
}